

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_subcommand_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *sub)

{
  stringstream out;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  ::std::__cxx11::string::string((string *)&local_1c0,(string *)&sub->name_);
  ::std::__cxx11::string::string((string *)&local_1e0,(string *)&sub->description_);
  detail::format_help(local_190,&local_1c0,&local_1e0,(this->super_FormatterBase).column_width_);
  ::std::__cxx11::string::~string((string *)&local_1e0);
  ::std::__cxx11::string::~string((string *)&local_1c0);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_subcommand(const App *sub) const {
    std::stringstream out;
    detail::format_help(out, sub->get_name(), sub->get_description(), column_width_);
    return out.str();
}